

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

UdpPortListSyntax * __thiscall slang::parsing::Parser::parseUdpPortList(Parser *this)

{
  bool bVar1;
  int iVar2;
  WildcardUdpPortListSyntax *pWVar3;
  SourceLocation SVar4;
  UdpPortDeclSyntax *pUVar5;
  IdentifierNameSyntax *pIVar6;
  undefined4 extraout_var;
  AnsiUdpPortListSyntax *pAVar7;
  undefined4 extraout_var_00;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *pIVar8;
  Token openParen;
  Token TVar9;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> ports;
  Token local_138;
  Token local_128;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_118;
  uint local_108;
  undefined8 local_f8;
  Token local_e8;
  Token local_d8;
  Token local_c8;
  Token local_b8;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_a8 [2];
  
  openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  bVar1 = ParserBase::peek(&this->super_ParserBase,DotStar);
  if (bVar1) {
    TVar9 = ParserBase::consume(&this->super_ParserBase);
    local_b8 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    local_c8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pWVar3 = slang::syntax::SyntaxFactory::wildcardUdpPortList
                       (&this->factory,openParen,TVar9,local_b8,local_c8);
    return &pWVar3->super_UdpPortListSyntax;
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,OutputKeyword);
  if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,InputKeyword), bVar1)) {
    Token::Token(&local_128);
    local_a8[0].data_ = (pointer)local_a8[0].firstElement;
    local_a8[0].len = 0;
    local_a8[0].cap = 4;
    local_138 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(local_138.kind);
    if (bVar1) {
      SVar4 = Token::location(&local_138);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x470005,SVar4);
      local_128 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
LAB_003331de:
      pIVar8 = local_128.info;
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleUdpPort(local_138.kind);
      if (bVar1) {
        do {
          local_138 = ParserBase::peek(&this->super_ParserBase);
          pUVar5 = parseUdpPortDecl(this);
          local_118._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pUVar5;
          local_108 = CONCAT31(local_108._1_3_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_a8,(TokenOrSyntax *)&local_118._M_first);
          TVar9 = ParserBase::peek(&this->super_ParserBase);
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
          if (bVar1) break;
          bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          if (!bVar1) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleUdpPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x470005,false);
              if (!bVar1) {
                local_128 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
                goto LAB_003331de;
              }
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_118._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_108 = local_108 & 0xffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_a8,(TokenOrSyntax *)&local_118._M_first);
          TVar9 = ParserBase::peek(&this->super_ParserBase);
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
          if (bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
          TVar9 = ParserBase::peek(&this->super_ParserBase);
        } while (((local_138.kind != TVar9.kind) || (local_138.info != TVar9.info)) ||
                (bVar1 = ParserBase::
                         skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleUdpPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                   (&this->super_ParserBase,(DiagCode)0x470005,true), bVar1));
        local_128 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
        goto LAB_003331de;
      }
      ParserBase::reportMissingList
                (&this->super_ParserBase,local_138,CloseParenthesis,&local_128,(DiagCode)0x470005);
      pIVar8 = extraout_RDX;
    }
    iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      (local_a8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,
                       (EVP_PKEY_CTX *)pIVar8);
    TVar9 = local_128;
    local_f8 = CONCAT44(extraout_var,iVar2);
    local_108 = 3;
    local_118 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)
                ZEXT816(0x4ecd00);
    local_d8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pAVar7 = slang::syntax::SyntaxFactory::ansiUdpPortList
                       (&this->factory,openParen,
                        (SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)&local_118._M_first
                        ,TVar9,local_d8);
    goto LAB_00333321;
  }
  Token::Token(&local_128);
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  local_a8[0].len = 0;
  local_a8[0].cap = 4;
  local_138 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(local_138.kind);
  if (bVar1) {
    SVar4 = Token::location(&local_138);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x470005,SVar4);
    local_128 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
LAB_00333291:
    pIVar8 = local_128.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isIdentifierOrComma(local_138.kind);
    if (bVar1) {
      do {
        local_138 = ParserBase::peek(&this->super_ParserBase);
        TVar9 = ParserBase::consume(&this->super_ParserBase);
        pIVar6 = slang::syntax::SyntaxFactory::identifierName(&this->factory,TVar9);
        local_118._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pIVar6;
        local_108 = CONCAT31(local_108._1_3_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_118._M_first);
        TVar9 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
        if (bVar1) break;
        bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
        if (!bVar1) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                              (&this->super_ParserBase,(DiagCode)0x470005,false);
            if (!bVar1) {
              local_128 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
              goto LAB_00333291;
            }
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar1);
        }
        local_118._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_108 = local_108 & 0xffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_118._M_first);
        TVar9 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9.kind);
        if (bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        TVar9 = ParserBase::peek(&this->super_ParserBase);
      } while (((local_138.kind != TVar9.kind) || (local_138.info != TVar9.info)) ||
              (bVar1 = ParserBase::
                       skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                 (&this->super_ParserBase,(DiagCode)0x470005,true), bVar1));
      local_128 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      goto LAB_00333291;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,local_138,CloseParenthesis,&local_128,(DiagCode)0x470005);
    pIVar8 = extraout_RDX_00;
  }
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_a8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar8)
  ;
  TVar9 = local_128;
  local_f8 = CONCAT44(extraout_var_00,iVar2);
  local_108 = 3;
  local_118 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)
              ZEXT816(0x4ed330);
  local_e8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pAVar7 = (AnsiUdpPortListSyntax *)
           slang::syntax::SyntaxFactory::nonAnsiUdpPortList
                     (&this->factory,openParen,
                      (SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)
                      &local_118._M_first,TVar9,local_e8);
LAB_00333321:
  if (local_a8[0].data_ != (pointer)local_a8[0].firstElement) {
    free(local_a8[0].data_);
  }
  return &pAVar7->super_UdpPortListSyntax;
}

Assistant:

UdpPortListSyntax& Parser::parseUdpPortList() {
    auto openParen = expect(TokenKind::OpenParenthesis);

    if (peek(TokenKind::DotStar)) {
        auto dotStar = consume();
        auto closeParen = expect(TokenKind::CloseParenthesis);
        return factory.wildcardUdpPortList(openParen, dotStar, closeParen,
                                           expect(TokenKind::Semicolon));
    }
    else if (peek(TokenKind::OutputKeyword) || peek(TokenKind::InputKeyword)) {
        Token closeParen;
        SmallVector<TokenOrSyntax, 4> ports;
        parseList<isPossibleUdpPort, isEndOfParenList>(ports, TokenKind::CloseParenthesis,
                                                       TokenKind::Comma, closeParen,
                                                       RequireItems::True, diag::ExpectedUdpPort,
                                                       [this] { return &parseUdpPortDecl(); });

        return factory.ansiUdpPortList(openParen, ports.copy(alloc), closeParen,
                                       expect(TokenKind::Semicolon));
    }
    else {
        Token closeParen;
        SmallVector<TokenOrSyntax, 4> ports;
        parseList<isIdentifierOrComma, isEndOfParenList>(
            ports, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen, RequireItems::True,
            diag::ExpectedUdpPort, [this] { return &factory.identifierName(consume()); });

        return factory.nonAnsiUdpPortList(openParen, ports.copy(alloc), closeParen,
                                          expect(TokenKind::Semicolon));
    }
}